

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delta.c
# Opt level: O3

void Delta_Decode(Byte *state,uint delta,Byte *data,SizeT size)

{
  long lVar1;
  Byte BVar2;
  Byte BVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong __n;
  size_t __n_00;
  Byte buf [256];
  Byte local_138 [264];
  
  __n = (ulong)delta;
  if (delta != 0) {
    memcpy(local_138,state,__n);
  }
  __n_00 = 0;
  uVar5 = 0;
  if (size != 0) {
    uVar4 = 0;
    do {
      if (delta == 0) {
        uVar6 = 0;
      }
      else {
        uVar7 = 0;
        do {
          BVar2 = data[uVar7 + uVar4];
          BVar3 = local_138[uVar7];
          data[uVar7 + uVar4] = BVar2 + BVar3;
          local_138[uVar7] = BVar2 + BVar3;
          uVar6 = uVar7 + 1;
          if (__n <= uVar6) break;
          lVar1 = uVar7 + uVar4;
          uVar7 = uVar6;
        } while (lVar1 + 1U < size);
        uVar4 = uVar4 + uVar6;
      }
      uVar5 = (uint)uVar6;
    } while (uVar4 < size);
  }
  if (uVar5 != delta) {
    __n_00 = (size_t)uVar5;
  }
  if (delta != (uint)__n_00) {
    memcpy(state,local_138 + __n_00,(ulong)(delta - (uint)__n_00));
  }
  if (__n_00 != 0) {
    memcpy(state + (__n - __n_00),local_138,__n_00);
  }
  return;
}

Assistant:

void Delta_Decode(Byte *state, unsigned delta, Byte *data, SizeT size)
{
  Byte buf[DELTA_STATE_SIZE];
  unsigned j = 0;
  MyMemCpy(buf, state, delta);
  {
    SizeT i;
    for (i = 0; i < size;)
    {
      for (j = 0; j < delta && i < size; i++, j++)
      {
        buf[j] = data[i] = (Byte)(buf[j] + data[i]);
      }
    }
  }
  if (j == delta)
    j = 0;
  MyMemCpy(state, buf + j, delta - j);
  MyMemCpy(state + delta - j, buf, j);
}